

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O0

void pzgeom::TPZGeoPrism::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int64_t iVar2;
  TPZFMatrix<double> *this;
  double *pdVar3;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<18,_double> dphi;
  TPZFNMatrix<6,_double> phi;
  double in_stack_fffffffffffffdc0;
  double *in_stack_fffffffffffffdc8;
  TPZFNMatrix<18,_double> *in_stack_fffffffffffffdd0;
  int local_220;
  int local_21c;
  TPZFMatrix<double> *in_stack_fffffffffffffe60;
  TPZFMatrix<double> *in_stack_fffffffffffffe68;
  TPZVec<double> *in_stack_fffffffffffffe70;
  
  TPZFNMatrix<6,_double>::TPZFNMatrix
            ((TPZFNMatrix<6,_double> *)in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
             (int64_t)in_stack_fffffffffffffdc0);
  TPZFNMatrix<18,_double>::TPZFNMatrix
            (in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
             (int64_t)in_stack_fffffffffffffdc0);
  pztopology::TPZPrism::TShape<double>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_21c = 0; local_21c < (int)iVar2; local_21c = local_21c + 1) {
    this = (TPZFMatrix<double> *)TPZVec<double>::operator[](in_RDX,(long)local_21c);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    for (local_220 = 0; local_220 < 6; local_220 = local_220 + 1) {
      in_stack_fffffffffffffdc8 =
           TPZFMatrix<double>::operator()
                     (this,(int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      dVar1 = *in_stack_fffffffffffffdc8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_21c,(long)local_220);
      in_stack_fffffffffffffdc0 = extraout_XMM0_Qa;
      pdVar3 = TPZVec<double>::operator[](in_RDX,(long)local_21c);
      *pdVar3 = dVar1 * in_stack_fffffffffffffdc0 + *pdVar3;
    }
  }
  TPZFNMatrix<18,_double>::~TPZFNMatrix((TPZFNMatrix<18,_double> *)0x161714e);
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x161715b);
  return;
}

Assistant:

inline void TPZGeoPrism::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 6; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }